

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * Cudd_addBddIthBit(DdManager *dd,DdNode *f,int bit)

{
  DdNode *index_00;
  DdNode *index;
  DdNode *res;
  int bit_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  index_00 = cuddUniqueConst(dd,(double)bit);
  if (index_00 == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)index_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)index_00 & 0xfffffffffffffffe) + 4) + 1;
    do {
      dd->reordered = 0;
      dd_local = (DdManager *)addBddDoIthBit(dd,f,index_00);
    } while (dd->reordered == 1);
    if (dd_local == (DdManager *)0x0) {
      Cudd_RecursiveDeref(dd,index_00);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,index_00);
      *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addBddIthBit(
  DdManager * dd,
  DdNode * f,
  int  bit)
{
    DdNode *res;
    DdNode *index;
    
    index = cuddUniqueConst(dd,(CUDD_VALUE_TYPE) bit);
    if (index == NULL) return(NULL);
    cuddRef(index);

    do {
        dd->reordered = 0;
        res = addBddDoIthBit(dd, f, index);
    } while (dd->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(dd, index);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, index);
    cuddDeref(res);
    return(res);

}